

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void qt_to_latin1_unchecked(uchar *dst,char16_t *src,qsizetype length)

{
  char16_t *pcVar1;
  uchar *puVar2;
  char16_t cVar3;
  char16_t cVar4;
  char16_t cVar5;
  char16_t cVar6;
  char16_t cVar7;
  char16_t cVar8;
  char16_t cVar9;
  char16_t cVar10;
  char16_t cVar11;
  char16_t cVar12;
  char16_t cVar13;
  char16_t cVar14;
  char16_t cVar15;
  char16_t cVar16;
  char16_t cVar17;
  char16_t cVar18;
  char16_t cVar19;
  char16_t cVar20;
  char16_t cVar21;
  char16_t cVar22;
  char16_t cVar23;
  char16_t cVar24;
  char16_t cVar25;
  char16_t cVar26;
  char16_t cVar27;
  char16_t cVar28;
  char16_t cVar29;
  char16_t cVar30;
  char16_t cVar31;
  char16_t cVar32;
  char16_t cVar33;
  char16_t cVar34;
  ulong uVar35;
  long lVar36;
  
  if ((ulong)length < 0x10) {
    for (lVar36 = 0; length != lVar36; lVar36 = lVar36 + 1) {
      dst[lVar36] = (uchar)src[lVar36];
    }
  }
  else {
    for (uVar35 = 0x20; uVar35 < (ulong)length; uVar35 = uVar35 + 0x10) {
      pcVar1 = src + (uVar35 - 0x20);
      cVar3 = *pcVar1;
      cVar4 = pcVar1[1];
      cVar5 = pcVar1[2];
      cVar6 = pcVar1[3];
      cVar7 = pcVar1[4];
      cVar8 = pcVar1[5];
      cVar9 = pcVar1[6];
      cVar10 = pcVar1[7];
      pcVar1 = src + (uVar35 - 0x18);
      cVar11 = *pcVar1;
      cVar12 = pcVar1[1];
      cVar13 = pcVar1[2];
      cVar14 = pcVar1[3];
      cVar15 = pcVar1[4];
      cVar16 = pcVar1[5];
      cVar17 = pcVar1[6];
      cVar18 = pcVar1[7];
      puVar2 = dst + (uVar35 - 0x20);
      *puVar2 = (L'\0' < cVar3) * (cVar3 < L'Ā') * (char)cVar3 - (L'ÿ' < cVar3);
      puVar2[1] = (L'\0' < cVar4) * (cVar4 < L'Ā') * (char)cVar4 - (L'ÿ' < cVar4);
      puVar2[2] = (L'\0' < cVar5) * (cVar5 < L'Ā') * (char)cVar5 - (L'ÿ' < cVar5);
      puVar2[3] = (L'\0' < cVar6) * (cVar6 < L'Ā') * (char)cVar6 - (L'ÿ' < cVar6);
      puVar2[4] = (L'\0' < cVar7) * (cVar7 < L'Ā') * (char)cVar7 - (L'ÿ' < cVar7);
      puVar2[5] = (L'\0' < cVar8) * (cVar8 < L'Ā') * (char)cVar8 - (L'ÿ' < cVar8);
      puVar2[6] = (L'\0' < cVar9) * (cVar9 < L'Ā') * (char)cVar9 - (L'ÿ' < cVar9);
      puVar2[7] = (L'\0' < cVar10) * (cVar10 < L'Ā') * (char)cVar10 - (L'ÿ' < cVar10);
      puVar2[8] = (L'\0' < cVar11) * (cVar11 < L'Ā') * (char)cVar11 - (L'ÿ' < cVar11);
      puVar2[9] = (L'\0' < cVar12) * (cVar12 < L'Ā') * (char)cVar12 - (L'ÿ' < cVar12);
      puVar2[10] = (L'\0' < cVar13) * (cVar13 < L'Ā') * (char)cVar13 - (L'ÿ' < cVar13);
      puVar2[0xb] = (L'\0' < cVar14) * (cVar14 < L'Ā') * (char)cVar14 - (L'ÿ' < cVar14);
      puVar2[0xc] = (L'\0' < cVar15) * (cVar15 < L'Ā') * (char)cVar15 - (L'ÿ' < cVar15);
      puVar2[0xd] = (L'\0' < cVar16) * (cVar16 < L'Ā') * (char)cVar16 - (L'ÿ' < cVar16);
      puVar2[0xe] = (L'\0' < cVar17) * (cVar17 < L'Ā') * (char)cVar17 - (L'ÿ' < cVar17);
      puVar2[0xf] = (L'\0' < cVar18) * (cVar18 < L'Ā') * (char)cVar18 - (L'ÿ' < cVar18);
    }
    pcVar1 = src + (uVar35 - 0x20);
    cVar3 = *pcVar1;
    cVar4 = pcVar1[1];
    cVar5 = pcVar1[2];
    cVar6 = pcVar1[3];
    cVar7 = pcVar1[4];
    cVar8 = pcVar1[5];
    cVar9 = pcVar1[6];
    cVar10 = pcVar1[7];
    pcVar1 = src + (uVar35 - 0x18);
    cVar11 = *pcVar1;
    cVar12 = pcVar1[1];
    cVar13 = pcVar1[2];
    cVar14 = pcVar1[3];
    cVar15 = pcVar1[4];
    cVar16 = pcVar1[5];
    cVar17 = pcVar1[6];
    cVar18 = pcVar1[7];
    pcVar1 = src + length + -0x10;
    cVar19 = *pcVar1;
    cVar20 = pcVar1[1];
    cVar21 = pcVar1[2];
    cVar22 = pcVar1[3];
    cVar23 = pcVar1[4];
    cVar24 = pcVar1[5];
    cVar25 = pcVar1[6];
    cVar26 = pcVar1[7];
    pcVar1 = src + length + -8;
    cVar27 = *pcVar1;
    cVar28 = pcVar1[1];
    cVar29 = pcVar1[2];
    cVar30 = pcVar1[3];
    cVar31 = pcVar1[4];
    cVar32 = pcVar1[5];
    cVar33 = pcVar1[6];
    cVar34 = pcVar1[7];
    puVar2 = dst + (uVar35 - 0x20);
    *puVar2 = (L'\0' < cVar3) * (cVar3 < L'Ā') * (char)cVar3 - (L'ÿ' < cVar3);
    puVar2[1] = (L'\0' < cVar4) * (cVar4 < L'Ā') * (char)cVar4 - (L'ÿ' < cVar4);
    puVar2[2] = (L'\0' < cVar5) * (cVar5 < L'Ā') * (char)cVar5 - (L'ÿ' < cVar5);
    puVar2[3] = (L'\0' < cVar6) * (cVar6 < L'Ā') * (char)cVar6 - (L'ÿ' < cVar6);
    puVar2[4] = (L'\0' < cVar7) * (cVar7 < L'Ā') * (char)cVar7 - (L'ÿ' < cVar7);
    puVar2[5] = (L'\0' < cVar8) * (cVar8 < L'Ā') * (char)cVar8 - (L'ÿ' < cVar8);
    puVar2[6] = (L'\0' < cVar9) * (cVar9 < L'Ā') * (char)cVar9 - (L'ÿ' < cVar9);
    puVar2[7] = (L'\0' < cVar10) * (cVar10 < L'Ā') * (char)cVar10 - (L'ÿ' < cVar10);
    puVar2[8] = (L'\0' < cVar11) * (cVar11 < L'Ā') * (char)cVar11 - (L'ÿ' < cVar11);
    puVar2[9] = (L'\0' < cVar12) * (cVar12 < L'Ā') * (char)cVar12 - (L'ÿ' < cVar12);
    puVar2[10] = (L'\0' < cVar13) * (cVar13 < L'Ā') * (char)cVar13 - (L'ÿ' < cVar13);
    puVar2[0xb] = (L'\0' < cVar14) * (cVar14 < L'Ā') * (char)cVar14 - (L'ÿ' < cVar14);
    puVar2[0xc] = (L'\0' < cVar15) * (cVar15 < L'Ā') * (char)cVar15 - (L'ÿ' < cVar15);
    puVar2[0xd] = (L'\0' < cVar16) * (cVar16 < L'Ā') * (char)cVar16 - (L'ÿ' < cVar16);
    puVar2[0xe] = (L'\0' < cVar17) * (cVar17 < L'Ā') * (char)cVar17 - (L'ÿ' < cVar17);
    puVar2[0xf] = (L'\0' < cVar18) * (cVar18 < L'Ā') * (char)cVar18 - (L'ÿ' < cVar18);
    puVar2 = dst + length + -0x10;
    *puVar2 = (L'\0' < cVar19) * (cVar19 < L'Ā') * (char)cVar19 - (L'ÿ' < cVar19);
    puVar2[1] = (L'\0' < cVar20) * (cVar20 < L'Ā') * (char)cVar20 - (L'ÿ' < cVar20);
    puVar2[2] = (L'\0' < cVar21) * (cVar21 < L'Ā') * (char)cVar21 - (L'ÿ' < cVar21);
    puVar2[3] = (L'\0' < cVar22) * (cVar22 < L'Ā') * (char)cVar22 - (L'ÿ' < cVar22);
    puVar2[4] = (L'\0' < cVar23) * (cVar23 < L'Ā') * (char)cVar23 - (L'ÿ' < cVar23);
    puVar2[5] = (L'\0' < cVar24) * (cVar24 < L'Ā') * (char)cVar24 - (L'ÿ' < cVar24);
    puVar2[6] = (L'\0' < cVar25) * (cVar25 < L'Ā') * (char)cVar25 - (L'ÿ' < cVar25);
    puVar2[7] = (L'\0' < cVar26) * (cVar26 < L'Ā') * (char)cVar26 - (L'ÿ' < cVar26);
    puVar2[8] = (L'\0' < cVar27) * (cVar27 < L'Ā') * (char)cVar27 - (L'ÿ' < cVar27);
    puVar2[9] = (L'\0' < cVar28) * (cVar28 < L'Ā') * (char)cVar28 - (L'ÿ' < cVar28);
    puVar2[10] = (L'\0' < cVar29) * (cVar29 < L'Ā') * (char)cVar29 - (L'ÿ' < cVar29);
    puVar2[0xb] = (L'\0' < cVar30) * (cVar30 < L'Ā') * (char)cVar30 - (L'ÿ' < cVar30);
    puVar2[0xc] = (L'\0' < cVar31) * (cVar31 < L'Ā') * (char)cVar31 - (L'ÿ' < cVar31);
    puVar2[0xd] = (L'\0' < cVar32) * (cVar32 < L'Ā') * (char)cVar32 - (L'ÿ' < cVar32);
    puVar2[0xe] = (L'\0' < cVar33) * (cVar33 < L'Ā') * (char)cVar33 - (L'ÿ' < cVar33);
    puVar2[0xf] = (L'\0' < cVar34) * (cVar34 < L'Ā') * (char)cVar34 - (L'ÿ' < cVar34);
  }
  return;
}

Assistant:

static void qt_to_latin1_internal(uchar *dst, const char16_t *src, qsizetype length)
{
#if defined(__SSE2__)
    auto questionMark256 = []() {
        if constexpr (UseAvx2)
            return _mm256_broadcastw_epi16(_mm_cvtsi32_si128('?'));
        else
            return 0;
    }();
    auto outOfRange256 = []() {
        if constexpr (UseAvx2)
            return _mm256_broadcastw_epi16(_mm_cvtsi32_si128(0x100));
        else
            return 0;
    }();
    __m128i questionMark, outOfRange;
    if constexpr (UseAvx2) {
        questionMark = _mm256_castsi256_si128(questionMark256);
        outOfRange = _mm256_castsi256_si128(outOfRange256);
    } else {
        questionMark = _mm_set1_epi16('?');
        outOfRange = _mm_set1_epi16(0x100);
    }

    auto mergeQuestionMarks = [=](__m128i chunk) {
        if (!Checked)
            return chunk;

        // SSE has no compare instruction for unsigned comparison.
        if constexpr (UseSse4_1) {
            // We use an unsigned uc = qMin(uc, 0x100) and then compare for equality.
            chunk = _mm_min_epu16(chunk, outOfRange);
            const __m128i offLimitMask = _mm_cmpeq_epi16(chunk, outOfRange);
            chunk = _mm_blendv_epi8(chunk, questionMark, offLimitMask);
            return chunk;
        }
        // The variables must be shiffted + 0x8000 to be compared
        const __m128i signedBitOffset = _mm_set1_epi16(short(0x8000));
        const __m128i thresholdMask = _mm_set1_epi16(short(0xff + 0x8000));

        const __m128i signedChunk = _mm_add_epi16(chunk, signedBitOffset);
        const __m128i offLimitMask = _mm_cmpgt_epi16(signedChunk, thresholdMask);

        // offLimitQuestionMark contains '?' for each 16 bits that was off-limit
        // the 16 bits that were correct contains zeros
        const __m128i offLimitQuestionMark = _mm_and_si128(offLimitMask, questionMark);

        // correctBytes contains the bytes that were in limit
        // the 16 bits that were off limits contains zeros
        const __m128i correctBytes = _mm_andnot_si128(offLimitMask, chunk);

        // merge offLimitQuestionMark and correctBytes to have the result
        chunk = _mm_or_si128(correctBytes, offLimitQuestionMark);

        Q_UNUSED(outOfRange);
        return chunk;
    };

    // we're going to read to src[offset..offset+15] (16 bytes)
    auto loadChunkAt = [=](qptrdiff offset) {
        __m128i chunk1, chunk2;
        if constexpr (UseAvx2) {
            __m256i chunk = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(src + offset));
            if (Checked) {
                // See mergeQuestionMarks lambda above for details
                chunk = _mm256_min_epu16(chunk, outOfRange256);
                const __m256i offLimitMask = _mm256_cmpeq_epi16(chunk, outOfRange256);
                chunk = _mm256_blendv_epi8(chunk, questionMark256, offLimitMask);
            }

            chunk2 = _mm256_extracti128_si256(chunk, 1);
            chunk1 = _mm256_castsi256_si128(chunk);
        } else {
            chunk1 = _mm_loadu_si128((const __m128i*)(src + offset)); // load
            chunk1 = mergeQuestionMarks(chunk1);

            chunk2 = _mm_loadu_si128((const __m128i*)(src + offset + 8)); // load
            chunk2 = mergeQuestionMarks(chunk2);
        }

        // pack the two vector to 16 x 8bits elements
        return _mm_packus_epi16(chunk1, chunk2);
    };

    if (size_t(length) >= sizeof(__m128i)) {
        // because of possible overlapping, we won't process the last chunk in the loop
        qptrdiff offset = 0;
        for ( ; offset + 2 * sizeof(__m128i) < size_t(length); offset += sizeof(__m128i))
            _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + offset), loadChunkAt(offset));

        // overlapped conversion of the last full chunk and the tail
        __m128i last1 = loadChunkAt(offset);
        __m128i last2 = loadChunkAt(length - sizeof(__m128i));
        _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + offset), last1);
        _mm_storeu_si128(reinterpret_cast<__m128i *>(dst + length - sizeof(__m128i)), last2);
        return;
    }

#  if !defined(__OPTIMIZE_SIZE__)
    if (length >= 4) {
        // this code is fine even for in-place conversion because we load both
        // before any store
        if (length >= 8) {
            __m128i chunk1 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(src));
            __m128i chunk2 = _mm_loadu_si128(reinterpret_cast<const __m128i *>(src + length - 8));
            chunk1 = mergeQuestionMarks(chunk1);
            chunk2 = mergeQuestionMarks(chunk2);

            // pack, where the upper half is ignored
            const __m128i result1 = _mm_packus_epi16(chunk1, chunk1);
            const __m128i result2 = _mm_packus_epi16(chunk2, chunk2);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst), result1);
            _mm_storel_epi64(reinterpret_cast<__m128i *>(dst + length - 8), result2);
        } else {
            __m128i chunk1 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(src));
            __m128i chunk2 = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(src + length - 4));
            chunk1 = mergeQuestionMarks(chunk1);
            chunk2 = mergeQuestionMarks(chunk2);

            // pack, we'll zero the upper three quarters
            const __m128i result1 = _mm_packus_epi16(chunk1, chunk1);
            const __m128i result2 = _mm_packus_epi16(chunk2, chunk2);
            qToUnaligned(_mm_cvtsi128_si32(result1), dst);
            qToUnaligned(_mm_cvtsi128_si32(result2), dst + length - 4);
        }
        return;
    }

    length = length % 4;
    return UnrollTailLoop<3>::exec(length, [=](qsizetype i) {
        if (Checked)
            dst[i] = (src[i]>0xff) ? '?' : (uchar) src[i];
        else
            dst[i] = src[i];
    });
#  else
    length = length % 16;
#  endif // optimize size
#elif defined(__ARM_NEON__)
    // Refer to the documentation of the SSE2 implementation.
    // This uses exactly the same method as for SSE except:
    // 1) neon has unsigned comparison
    // 2) packing is done to 64 bits (8 x 8bits component).
    if (length >= 16) {
        const qsizetype chunkCount = length >> 3; // divided by 8
        const uint16x8_t questionMark = vdupq_n_u16('?'); // set
        const uint16x8_t thresholdMask = vdupq_n_u16(0xff); // set
        for (qsizetype i = 0; i < chunkCount; ++i) {
            uint16x8_t chunk = vld1q_u16((uint16_t *)src); // load
            src += 8;

            if (Checked) {
                const uint16x8_t offLimitMask = vcgtq_u16(chunk, thresholdMask); // chunk > thresholdMask
                const uint16x8_t offLimitQuestionMark = vandq_u16(offLimitMask, questionMark); // offLimitMask & questionMark
                const uint16x8_t correctBytes = vbicq_u16(chunk, offLimitMask); // !offLimitMask & chunk
                chunk = vorrq_u16(correctBytes, offLimitQuestionMark); // correctBytes | offLimitQuestionMark
            }
            const uint8x8_t result = vmovn_u16(chunk); // narrowing move->packing
            vst1_u8(dst, result); // store
            dst += 8;
        }
        length = length % 8;
    }
#endif
#if defined(__mips_dsp)
    static_assert(sizeof(qsizetype) == sizeof(int),
                  "oops, the assembler implementation needs to be called in a loop");
    qt_toLatin1_mips_dsp_asm(dst, src, length);
#else
    while (length--) {
        if (Checked)
            *dst++ = (*src>0xff) ? '?' : (uchar) *src;
        else
            *dst++ = *src;
        ++src;
    }
#endif
}